

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O3

qint64 __thiscall
QHttpNetworkReplyPrivate::readStatus(QHttpNetworkReplyPrivate *this,QIODevice *socket)

{
  ArrayOptions *pAVar1;
  QByteArray *pQVar2;
  char cVar3;
  bool bVar4;
  Data *pDVar5;
  long lVar6;
  char *pcVar7;
  qint64 qVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView status;
  QByteArrayView QVar10;
  char c;
  byte local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = &this->fragment;
  if ((this->fragment).d.size == 0) {
    pDVar5 = (pQVar2->d).d;
    if (((pDVar5 == (Data *)0x0) ||
        (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       (lVar6 = (pDVar5->super_QArrayData).alloc,
       (long)((((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) + lVar6)
             - (long)(this->fragment).d.ptr) < 0x20)) {
      QByteArray::reallocData((longlong)pQVar2,0x20);
      pDVar5 = (pQVar2->d).d;
      if (pDVar5 == (Data *)0x0) goto LAB_0020a3e1;
      lVar6 = (pDVar5->super_QArrayData).alloc;
    }
    if (lVar6 != 0) {
      pAVar1 = &(pDVar5->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
LAB_0020a3e1:
  local_39 = 0xaa;
  qVar8 = 0;
  do {
    lVar6 = QIODevice::read((char *)socket,(longlong)&local_39);
    if (lVar6 == -1) {
      qVar8 = -1;
      break;
    }
    if (lVar6 == 0) break;
    if (((lVar6 != 1) || ((this->fragment).d.size != 0)) ||
       ((0x20 < (ulong)local_39 || ((0x180002c00U >> ((ulong)local_39 & 0x3f) & 1) == 0)))) {
      qVar8 = qVar8 + 1;
      if (local_39 == 10) {
        pcVar7 = (this->fragment).d.ptr;
        lVar6 = (this->fragment).d.size;
        if (lVar6 == 0) {
          lVar6 = 0;
        }
        else if (pcVar7[lVar6 + -1] == '\r') {
          QByteArray::truncate((longlong)pQVar2);
          pcVar7 = (this->fragment).d.ptr;
          lVar6 = (this->fragment).d.size;
        }
        status.m_data = pcVar7;
        status.m_size = lVar6;
        bVar4 = QHttpHeaderParser::parseStatus
                          (&(this->super_QHttpNetworkHeaderPrivate).parser,status);
        this->state = ReadingHeaderState;
        QByteArray::clear();
        if (!bVar4) {
          qVar8 = -1;
        }
        break;
      }
      QByteArray::append((char)pQVar2);
      if (((this->fragment).d.size == 5) &&
         (QVar9.m_data = (this->fragment).d.ptr, QVar9.m_size = 5, QVar10.m_data = "HTTP/",
         QVar10.m_size = 5, cVar3 = QtPrivate::startsWith(QVar9,QVar10), cVar3 == '\0')) {
        QByteArray::clear();
        qVar8 = -1;
        break;
      }
    }
  } while (lVar6 == 1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return qVar8;
}

Assistant:

qint64 QHttpNetworkReplyPrivate::readStatus(QIODevice *socket)
{
    if (fragment.isEmpty()) {
        // reserve bytes for the status line. This is better than always append() which reallocs the byte array
        fragment.reserve(32);
    }

    qint64 bytes = 0;
    char c;
    qint64 haveRead = 0;

    do {
        haveRead = socket->read(&c, 1);
        if (haveRead == -1)
            return -1; // unexpected EOF
        else if (haveRead == 0)
            break; // read more later
        else if (haveRead == 1 && fragment.size() == 0 && (c == 11 || c == '\n' || c == '\r' || c == ' ' || c == 31))
            continue; // Ignore all whitespace that was trailing froma previous request on that socket

        bytes++;

        // allow both CRLF & LF (only) line endings
        if (c == '\n') {
            // remove the CR at the end
            if (fragment.endsWith('\r')) {
                fragment.truncate(fragment.size()-1);
            }
            bool ok = parseStatus(fragment);
            state = ReadingHeaderState;
            fragment.clear();
            if (!ok) {
                return -1;
            }
            break;
        } else {
            fragment.append(c);
        }

        // is this a valid reply?
        if (fragment.size() == 5 && !fragment.startsWith("HTTP/")) {
            fragment.clear();
            return -1;
        }
    } while (haveRead == 1);

    return bytes;
}